

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz.c
# Opt level: O0

size_t duckdb_je_sz_psz_quantize_ceil(size_t size)

{
  size_t in_RDI;
  size_t ret;
  pszind_t ind;
  pszind_t base_ind;
  pszind_t rg_inner_off;
  pszind_t lg_delta;
  pszind_t off_to_first_ps_rg;
  pszind_t x;
  size_t local_38;
  
  local_38 = duckdb_je_sz_psz_quantize_floor(in_RDI);
  if (local_38 < in_RDI) {
    if ((local_38 - duckdb_je_sz_large_pad) + 1 < 0x7000000000000001) {
      lg_ceil(0x257e459);
    }
    local_38 = sz_pind2sz(0);
    local_38 = local_38 + duckdb_je_sz_large_pad;
  }
  return local_38;
}

Assistant:

size_t
sz_psz_quantize_ceil(size_t size) {
	size_t ret;

	assert(size > 0);
	assert(size - sz_large_pad <= SC_LARGE_MAXCLASS);
	assert((size & PAGE_MASK) == 0);

	ret = sz_psz_quantize_floor(size);
	if (ret < size) {
		/*
		 * Skip a quantization that may have an adequately large extent,
		 * because under-sized extents may be mixed in.  This only
		 * happens when an unusual size is requested, i.e. for aligned
		 * allocation, and is just one of several places where linear
		 * search would potentially find sufficiently aligned available
		 * memory somewhere lower.
		 */
		ret = sz_pind2sz(sz_psz2ind(ret - sz_large_pad + 1)) +
		    sz_large_pad;
	}
	return ret;
}